

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdfs_test.cpp
# Opt level: O2

void FrequencyTable(BSDF *bsdf,Vector3f *wo,RNG *rng,int sampleCount,int thetaRes,int phiRes,
                   Float *target)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  float fVar8;
  float fVar9;
  undefined8 uVar11;
  undefined1 auVar10 [16];
  Vector3f VVar12;
  Point2f sample;
  BSDFSample bs;
  
  memset(target,0,(long)(phiRes * thetaRes) << 2);
  uVar5 = ~(sampleCount >> 0x1f) & sampleCount;
  while (bVar6 = uVar5 != 0, uVar5 = uVar5 - 1, bVar6) {
    fVar8 = pbrt::RNG::Uniform<float>(rng);
    fVar9 = pbrt::RNG::Uniform<float>(rng);
    sample.super_Tuple2<pbrt::Point2,_float>.y = pbrt::RNG::Uniform<float>(rng);
    sample.super_Tuple2<pbrt::Point2,_float>.x = fVar9;
    pbrt::BSDF::Sample_f
              (&bs,bsdf,(Vector3f)wo->super_Tuple3<pbrt::Vector3,_float>,fVar8,&sample,Radiance,All)
    ;
    uVar11 = 0;
    if ((0.0 < bs.pdf) && (((undefined1)bs.flags & Specular) == Unset)) {
      VVar12 = pbrt::Frame::ToLocal(&bsdf->shadingFrame,&bs.wi);
      fVar8 = pbrt::SafeACos(VVar12.super_Tuple3<pbrt::Vector3,_float>.z);
      auVar7._8_8_ = uVar11;
      auVar7._0_8_ = VVar12.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar10 = ZEXT416((uint)(fVar8 * ((float)thetaRes / 3.1415927)));
      auVar10 = vroundss_avx(auVar10,auVar10,9);
      auVar7 = vmovshdup_avx(auVar7);
      fVar8 = atan2f(auVar7._0_4_,VVar12.super_Tuple3<pbrt::Vector3,_float>.x);
      fVar8 = ((float)phiRes / 6.2831855) * fVar8;
      auVar7 = vfmadd231ss_fma(ZEXT416((uint)fVar8),ZEXT416((uint)((float)phiRes / 6.2831855)),
                               ZEXT416(0x40c90fdb));
      uVar3 = ~((int)auVar10._0_4_ >> 0x1f) & (int)auVar10._0_4_;
      uVar1 = thetaRes - 1U;
      if ((int)uVar3 <= (int)(thetaRes - 1U)) {
        uVar1 = uVar3;
      }
      uVar11 = vcmpss_avx512f(ZEXT416((uint)fVar8),ZEXT416(0),1);
      bVar6 = (bool)((byte)uVar11 & 1);
      auVar7 = ZEXT416((uint)bVar6 * auVar7._0_4_ + (uint)!bVar6 * (int)fVar8);
      auVar7 = vroundss_avx(auVar7,auVar7,9);
      uVar4 = ~((int)auVar7._0_4_ >> 0x1f) & (int)auVar7._0_4_;
      uVar3 = phiRes - 1U;
      if ((int)uVar4 <= (int)(phiRes - 1U)) {
        uVar3 = uVar4;
      }
      iVar2 = uVar1 * phiRes + uVar3;
      target[iVar2] = target[iVar2] + 1.0;
    }
  }
  return;
}

Assistant:

void FrequencyTable(const BSDF* bsdf, const Vector3f& wo, RNG& rng, int sampleCount,
                    int thetaRes, int phiRes, Float* target) {
    memset(target, 0, thetaRes * phiRes * sizeof(Float));

    Float factorTheta = thetaRes / Pi, factorPhi = phiRes / (2 * Pi);

    Vector3f wi;
    for (int i = 0; i < sampleCount; ++i) {
        Float u = rng.Uniform<Float>();
        Point2f sample{rng.Uniform<Float>(), rng.Uniform<Float>()};
        BSDFSample bs = bsdf->Sample_f(wo, u, sample);

        if (!bs || bs.IsSpecular())
            continue;

        Vector3f wiL = bsdf->RenderToLocal(bs.wi);

        Point2f coords(SafeACos(wiL.z) * factorTheta,
                       std::atan2(wiL.y, wiL.x) * factorPhi);

        if (coords.y < 0)
            coords.y += 2 * Pi * factorPhi;

        int thetaBin = std::min(std::max(0, (int)std::floor(coords.x)), thetaRes - 1);
        int phiBin = std::min(std::max(0, (int)std::floor(coords.y)), phiRes - 1);

        target[thetaBin * phiRes + phiBin] += 1;
    }
}